

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O1

void __thiscall
TPZFrontNonSym<double>::ExtractFrontMatrix(TPZFrontNonSym<double> *this,TPZFMatrix<double> *front)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar2 = (this->super_TPZFront<double>).fLocal.fNElements;
  lVar7 = (this->super_TPZFront<double>).fNextRigidBodyMode;
  if (lVar7 < lVar2) {
    do {
      iVar5 = Local(this,lVar7);
      (this->super_TPZFront<double>).fData.fStore
      [(long)(this->super_TPZFront<double>).fMaxFront * (long)iVar5 + (long)iVar5] = 1.0;
      lVar7 = lVar7 + 1;
    } while (lVar2 != lVar7);
  }
  if (lVar2 < 1) {
    lVar7 = 0;
  }
  else {
    lVar8 = 0;
    do {
      lVar7 = lVar8;
      if ((this->super_TPZFront<double>).fLocal.fStore[lVar8] != -1) break;
      lVar8 = lVar8 + 1;
      lVar7 = lVar2;
    } while (lVar2 != lVar8);
  }
  (*(front->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (front,lVar2 - lVar7);
  if (lVar7 < lVar2) {
    lVar8 = lVar7;
    do {
      if (((this->super_TPZFront<double>).fLocal.fStore[lVar8] != -1) && (0 < lVar2)) {
        lVar6 = lVar8 - lVar7;
        lVar9 = 0;
        do {
          plVar3 = (this->super_TPZFront<double>).fLocal.fStore;
          lVar4 = plVar3[lVar9];
          if (lVar4 != -1) {
            lVar1 = lVar9 - lVar7;
            if ((((lVar6 < 0) ||
                 ((front->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
                (lVar1 < 0)) || ((front->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar1)
               ) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            front->fElem[lVar1 * (front->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + lVar6]
                 = (this->super_TPZFront<double>).fData.fStore
                   [lVar4 * (this->super_TPZFront<double>).fMaxFront + plVar3[lVar8]];
          }
          lVar9 = lVar9 + 1;
        } while (lVar2 != lVar9);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar2);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	// Extend the front with the non initialized rigid body modes
	int64_t ieq;
	int64_t maxeq = this->fLocal.NElements();
	for (ieq = this->fNextRigidBodyMode; ieq< maxeq; ieq++) {
		int ilocal = Local(ieq);
		Element(ilocal, ilocal) = 1.;
	}
	
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=0;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
		}
	}
	
}